

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O1

void __thiscall Num::delereZeros(Num *this,Num *number)

{
  string *psVar1;
  int iVar2;
  ushort length;
  undefined4 *puVar3;
  short sVar4;
  ulong uVar5;
  Byte BVar6;
  char *pcVar7;
  char *this_00;
  Num *this_01;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined8 uStack_70;
  Num *pNStack_68;
  char *pcStack_60;
  char *pcStack_58;
  string *psStack_50;
  ulong uStack_48;
  code *pcStack_40;
  
  uVar5 = (ulong)(ushort)(number->base)._M_string_length;
  psVar1 = &number->base;
  while( true ) {
    sVar4 = (short)uVar5;
    uVar8 = uVar5 - 1;
    if (((ushort)uVar8 < (ushort)(number->base)._M_string_length) &&
       ((number->base)._M_dataplus._M_p[uVar8 & 0xffff] != '0')) break;
    if (sVar4 == 1) {
      pcStack_40 = (code *)0x102eed;
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) break;
    }
    pcStack_40 = (code *)0x102efc;
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    uVar5 = (ulong)(ushort)(sVar4 - 1);
    if ((sVar4 == 0) && (iVar2 == 0)) break;
    if ((number->base)._M_string_length < uVar8) {
      this_00 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
      pcVar7 = "basic_string::erase";
      pcStack_40 = operator-;
      auVar9 = std::__throw_out_of_range_fmt
                         ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                          "basic_string::erase",uVar8);
      puVar3 = auVar9._8_8_;
      uStack_70 = auVar9._0_8_;
      pcStack_58 = "";
      pcStack_60 = "0";
      length = (ushort)*puVar3;
      if ((ushort)*puVar3 < (ushort)*(undefined4 *)pcVar7) {
        length = (ushort)*(undefined4 *)pcVar7;
      }
      this_01 = (Num *)this_00;
      pNStack_68 = number;
      psStack_50 = psVar1;
      uStack_48 = uVar8;
      pcStack_40 = (code *)uVar5;
      Num((Num *)this_00,length,0);
      uStack_70 = uStack_70 & 0xffffffff;
      if (length != 0) {
        uVar5 = 0;
        do {
          this_01 = (Num *)0x0;
          if (uVar5 < *(ushort *)(pcVar7 + 0x10)) {
            this_01 = (Num *)(ulong)((int)*(char *)(*(long *)(pcVar7 + 8) + uVar5) - 0x30);
          }
          BVar6 = 0;
          if (uVar5 < *(ushort *)(puVar3 + 4)) {
            BVar6 = (int)*(char *)(*(long *)(puVar3 + 2) + uVar5) - 0x30;
          }
          BVar6 = Multiplicator::baseSubstraction
                            ((Byte)this_01,BVar6,(Byte *)((long)&uStack_70 + 4));
          ((Num *)this_00)->size = (Short)uVar5;
          (((Num *)this_00)->base)._M_dataplus._M_p[uVar5] = (char)BVar6 + '0';
          uVar5 = uVar5 + 1;
        } while (length != uVar5);
      }
      delereZeros(this_01,(Num *)this_00);
      return;
    }
    (number->base)._M_string_length = uVar8;
    (number->base)._M_dataplus._M_p[uVar8] = '\0';
  }
  number->size = (Short)(number->base)._M_string_length;
  return;
}

Assistant:

void Num::delereZeros(Num& number) // delete insignificant zeros
{
    Num::Short k = number.getSize();
    while (number.getDigit(k - 1) == 0)
    {
        if ((k == 1 && number.base == "0") || (number.base == "" && k == 0))
            break;
        number.base.erase(k - 1);
        --k;
    }
    number.size = number.base.size();
}